

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O2

void softfloat_to_vfp_compare(CPUARMState_conflict *env,int cmp)

{
  if (cmp + 1U < 4) {
    (env->vfp).xregs[1] =
         (env->vfp).xregs[1] & 0xfffffff | *(uint *)(&DAT_00b7a24c + (ulong)(cmp + 1U) * 4);
    return;
  }
  g_assertion_message_expr
            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/vfp_helper.c"
             ,0x11a,(char *)0x0);
}

Assistant:

static void softfloat_to_vfp_compare(CPUARMState *env, int cmp)
{
    uint32_t flags = 0;
    switch (cmp) {
    case float_relation_equal:
        flags = 0x6;
        break;
    case float_relation_less:
        flags = 0x8;
        break;
    case float_relation_greater:
        flags = 0x2;
        break;
    case float_relation_unordered:
        flags = 0x3;
        break;
    default:
        g_assert_not_reached();
        break;
    }
    env->vfp.xregs[ARM_VFP_FPSCR] =
        deposit32(env->vfp.xregs[ARM_VFP_FPSCR], 28, 4, flags);
}